

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_context.cpp
# Opt level: O2

HLPContext * __thiscall
r_exec::HLPContext::operator*(HLPContext *__return_storage_ptr__,HLPContext *this)

{
  undefined2 uVar1;
  char cVar2;
  uint16_t uVar3;
  Atom *pAVar4;
  HLPOverlay *pHVar5;
  Data DVar6;
  HLPContext HStack_38;
  
  cVar2 = r_code::Atom::getDescriptor();
  if (cVar2 == -0x77) {
    pAVar4 = r_code::vector<r_code::Atom>::operator[](&((this->super__Context).overlay)->values,0);
    uVar3 = r_code::Atom::asIndex();
    pHVar5 = (HLPOverlay *)(this->super__Context).overlay;
    DVar6 = VALUE_ARRAY;
  }
  else if (cVar2 == -0x7a) {
    pHVar5 = (HLPOverlay *)(this->super__Context).overlay;
    uVar3 = r_code::Atom::asIndex();
    pAVar4 = HLPOverlay::get_value_code(pHVar5,uVar3);
    if (pAVar4 == (Atom *)0x0) {
      HLPContext(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    pHVar5 = (HLPOverlay *)(this->super__Context).overlay;
    DVar6 = BINDING_MAP;
    uVar3 = 0;
  }
  else {
    if (cVar2 != -0x7c) {
      uVar1 = *(undefined2 *)&(this->super__Context).field_0x1a;
      DVar6 = (this->super__Context).data;
      (__return_storage_ptr__->super__Context).index = (this->super__Context).index;
      *(undefined2 *)&(__return_storage_ptr__->super__Context).field_0x1a = uVar1;
      (__return_storage_ptr__->super__Context).data = DVar6;
      pAVar4 = (this->super__Context).code;
      (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
      (__return_storage_ptr__->super__Context).code = pAVar4;
      (__return_storage_ptr__->super__Context)._vptr__Context =
           (_func_int **)&PTR___Context_001d1ff8;
      return __return_storage_ptr__;
    }
    pAVar4 = (this->super__Context).code;
    uVar3 = r_code::Atom::asIndex();
    pHVar5 = (HLPOverlay *)(this->super__Context).overlay;
    DVar6 = (this->super__Context).data;
  }
  HLPContext(&HStack_38,pAVar4,uVar3,pHVar5,DVar6);
  operator*(__return_storage_ptr__,&HStack_38);
  return __return_storage_ptr__;
}

Assistant:

HLPContext HLPContext::operator *() const
{
    switch ((*this)[0].getDescriptor()) {
    case Atom::I_PTR:
        return *HLPContext(code, (*this)[0].asIndex(), (HLPOverlay *)overlay, data);

    case Atom::VL_PTR: {
        Atom *value_code = ((HLPOverlay *)overlay)->get_value_code((*this)[0].asIndex());

        if (value_code) {
            return *HLPContext(value_code, 0, (HLPOverlay *)overlay, BINDING_MAP);
        } else { // unbound variable.
            return HLPContext();    // data=undefined: evaluation will return false.
        }
    }

    case Atom::VALUE_PTR:
        return *HLPContext(&overlay->values[0], (*this)[0].asIndex(), (HLPOverlay *)overlay, VALUE_ARRAY);

    default:
        return *this;
    }
}